

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O3

DirWatcherGeneric * __thiscall
efsw::DirWatcherGeneric::createDirectory(DirWatcherGeneric *this,string *newdir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  WatcherGeneric *pWVar3;
  FileWatcherImpl *pFVar4;
  string *psVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  bool *pbVar9;
  DirWatcherGeneric *this_00;
  mapped_type *ppDVar10;
  _Alloc_hider _Var11;
  string curPath;
  string dir;
  string link;
  string parentPath;
  FileInfo fi;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  FileInfo local_78;
  
  FileSystem::dirRemoveSlashAtEnd(newdir);
  pcVar2 = (newdir->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + newdir->_M_string_length);
  FileSystem::fileNameFromPath(&local_78.Filepath,&local_98);
  std::__cxx11::string::operator=((string *)newdir,(string *)&local_78);
  paVar1 = &local_78.Filepath.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Filepath._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.Filepath._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  pcVar2 = (this->DirSnap).DirectoryInfo.Filepath._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,
             pcVar2 + (this->DirSnap).DirectoryInfo.Filepath._M_string_length);
  FileSystem::dirAddSlashAtEnd(&local_b8);
  std::operator+(&local_178,&local_b8,newdir);
  FileSystem::dirAddSlashAtEnd(&local_178);
  FileInfo::FileInfo(&local_78,&local_178);
  bVar6 = FileInfo::isDirectory(&local_78);
  if (bVar6) {
    bVar6 = FileInfo::isReadable(&local_78);
    if (bVar6) {
      bVar6 = FileSystem::isRemoteFS(&local_178);
      if (!bVar6) {
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        local_198._M_string_length = 0;
        local_198.field_2._M_local_buf[0] = '\0';
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_178._M_dataplus._M_p,
                   local_178._M_dataplus._M_p + local_178._M_string_length);
        FileSystem::getLinkRealPath(&local_118,&local_d8,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        iVar8 = std::__cxx11::string::compare((char *)&local_118);
        pWVar3 = this->Watch;
        if (iVar8 == 0) {
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,local_178._M_dataplus._M_p,
                     local_178._M_dataplus._M_p + local_178._M_string_length);
          bVar6 = WatcherGeneric::pathInWatches(pWVar3,&local_158);
          if (bVar6) {
            psVar5 = &local_158;
            _Var11._M_p = local_158._M_dataplus._M_p;
LAB_0011967e:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var11._M_p != &psVar5->field_2) {
              operator_delete(_Var11._M_p);
            }
LAB_001197ce:
            this_00 = (DirWatcherGeneric *)0x0;
          }
          else {
            pFVar4 = this->Watch->WatcherImpl;
            iVar8 = (*pFVar4->_vptr_FileWatcherImpl[10])(pFVar4,&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p);
            }
            if ((char)iVar8 != '\0') goto LAB_001196c4;
LAB_00119727:
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
            handleAction(this,newdir,1,&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p);
            }
            this_00 = (DirWatcherGeneric *)operator_new(0xc0);
            DirWatcherGeneric(this_00,this,this->Watch,&local_178,this->Recursive,false);
            addChilds(this_00,true);
            watch(this_00,false);
            ppDVar10 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
                       ::operator[](&this->Directories,newdir);
            *ppDVar10 = this_00;
          }
        }
        else {
          pbVar9 = FileWatcher::followSymlinks(pWVar3->WatcherImpl->mFileWatcher);
          bVar6 = *pbVar9;
          pFVar4 = this->Watch->WatcherImpl;
          iVar8 = (*pFVar4->_vptr_FileWatcherImpl[10])(pFVar4,&local_118);
          if ((char)iVar8 == '\0') {
            pWVar3 = this->Watch;
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_138,local_118._M_dataplus._M_p,
                       local_118._M_dataplus._M_p + local_118._M_string_length);
            bVar7 = WatcherGeneric::pathInWatches(pWVar3,&local_138);
            if (bVar7) {
              psVar5 = &local_138;
              _Var11._M_p = local_138._M_dataplus._M_p;
              goto LAB_0011967e;
            }
            pFVar4 = this->Watch->WatcherImpl;
            iVar8 = (*pFVar4->_vptr_FileWatcherImpl[9])(pFVar4,&local_198,&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            if ((char)iVar8 == '\0') goto LAB_001197ce;
            std::__cxx11::string::_M_assign((string *)&local_178);
            if (bVar6 != false) goto LAB_00119727;
          }
LAB_001196c4:
          this_00 = (DirWatcherGeneric *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        goto LAB_001194ee;
      }
    }
  }
  this_00 = (DirWatcherGeneric *)0x0;
LAB_001194ee:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Filepath._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.Filepath._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return this_00;
}

Assistant:

DirWatcherGeneric* DirWatcherGeneric::createDirectory( std::string newdir ) {
	FileSystem::dirRemoveSlashAtEnd( newdir );
	newdir = FileSystem::fileNameFromPath( newdir );

	DirWatcherGeneric* dw = NULL;

	/// Check if the directory is a symbolic link
	std::string parentPath( DirSnap.DirectoryInfo.Filepath );
	FileSystem::dirAddSlashAtEnd( parentPath );
	std::string dir( parentPath + newdir );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() || !fi.isReadable() || FileSystem::isRemoteFS( dir ) ) {
		return NULL;
	}

	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );
	bool skip = false;

	if ( "" != link ) {
		/// Avoid adding symlinks directories if it's now enabled
		if ( !Watch->WatcherImpl->mFileWatcher->followSymlinks() ) {
			skip = true;
		}

		/// If it's a symlink check if the realpath exists as a watcher, or
		/// if the path is outside the current dir
		if ( Watch->WatcherImpl->pathInWatches( link ) || Watch->pathInWatches( link ) ||
			 !Watch->WatcherImpl->linkAllowed( curPath, link ) ) {
			skip = true;
		} else {
			dir = link;
		}
	} else {
		if ( Watch->pathInWatches( dir ) || Watch->WatcherImpl->pathInWatches( dir ) ) {
			skip = true;
		}
	}

	if ( !skip ) {
		handleAction( newdir, Actions::Add );

		/// Creates the new directory watcher of the subfolder and check for new files
		dw = new DirWatcherGeneric( this, Watch, dir, Recursive );

		dw->addChilds();

		dw->watch();

		/// Add it to the list of directories
		Directories[newdir] = dw;
	}

	return dw;
}